

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

char * nlohmann::json_abi_v3_11_3::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  byte bVar5;
  undefined8 uVar6;
  uint uVar7;
  
  if (min_exp < 0) {
    if (max_exp < 1) {
      pcVar4 = "max_exp > 0";
      uVar6 = 0x45e4;
    }
    else {
      uVar7 = decimal_exponent + len;
      if ((int)uVar7 <= max_exp && -1 < decimal_exponent) {
        memset(buf + len,0x30,(long)(int)uVar7 - (long)len);
        pcVar4 = buf + (int)uVar7;
        pcVar4[0] = '.';
        pcVar4[1] = '0';
        return pcVar4 + 2;
      }
      if ((int)uVar7 < 1 || max_exp < (int)uVar7) {
        if ((int)uVar7 < 1 && min_exp < (int)uVar7) {
          memmove(buf + (ulong)-uVar7 + 2,buf,(long)len);
          buf[0] = '0';
          buf[1] = '.';
          memset(buf + 2,0x30,(ulong)-uVar7);
          return buf + (ulong)-uVar7 + 2 + len;
        }
        if (len != 1) {
          memmove(buf + 2,buf + 1,(long)len - 1);
          buf[1] = '.';
          buf = buf + len;
        }
        buf[1] = 'e';
        if ((int)uVar7 < -0x3e6) {
          pcVar4 = "e > -1000";
          uVar6 = 0x45ae;
        }
        else {
          if ((int)uVar7 < 0x3e9) {
            uVar1 = uVar7 - 1;
            uVar2 = -uVar1;
            if (0 < (int)uVar1) {
              uVar2 = uVar1;
            }
            buf[2] = ((int)uVar7 < 1) * '\x02' + '+';
            if (uVar2 < 10) {
              buf[3] = '0';
            }
            else {
              if (99 < uVar2) {
                buf[3] = (char)(uVar2 / 100) + '0';
                bVar5 = (byte)((ulong)(uVar2 % 100) * 0x1999999a >> 0x20);
                buf[4] = bVar5 | 0x30;
                buf[5] = (char)(uVar2 % 100) + bVar5 * -10 | 0x30;
                return buf + 6;
              }
              buf[3] = (byte)((ulong)uVar2 / 10) | 0x30;
              uVar2 = uVar2 + (uVar2 / 10 + uVar2 / 10) * -5;
            }
            buf[4] = (byte)uVar2 | 0x30;
            return buf + 5;
          }
          pcVar4 = "e < 1000";
          uVar6 = 0x45af;
        }
      }
      else {
        if (decimal_exponent < 0) {
          uVar3 = (ulong)uVar7;
          memmove(buf + uVar3 + 1,buf + uVar3,(uint)len - uVar3);
          buf[uVar3] = '.';
          return buf + (ulong)(uint)len + 1;
        }
        pcVar4 = "k > n";
        uVar6 = 0x45fe;
      }
    }
  }
  else {
    pcVar4 = "min_exp < 0";
    uVar6 = 0x45e3;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp",
             uVar6,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    JSON_ASSERT(min_exp < 0);
    JSON_ASSERT(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n && n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n) - static_cast<size_t>(k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (static_cast<size_t>(n) + 2);
    }

    if (0 < n && n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        JSON_ASSERT(k > n);

        std::memmove(buf + (static_cast<size_t>(n) + 1), buf + n, static_cast<size_t>(k) - static_cast<size_t>(n));
        buf[n] = '.';
        return buf + (static_cast<size_t>(k) + 1U);
    }

    if (min_exp < n && n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + static_cast<size_t>(-n)), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2U + static_cast<size_t>(-n) + static_cast<size_t>(k));
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k) - 1);
        buf[1] = '.';
        buf += 1 + static_cast<size_t>(k);
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}